

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseFactor(StructuralParser *this)

{
  bool bVar1;
  Handle h;
  Expression *pEVar2;
  QualifiedIdentifier *expression;
  undefined8 extraout_RDX;
  char *pcVar3;
  Value *this_00;
  complex<double> v;
  string_view text;
  pool_ptr<soul::AST::Expression> type;
  Value local_250;
  Value local_210;
  Value local_1d0;
  Value local_190;
  Value local_150;
  Value local_110;
  Value local_d0;
  Value local_90;
  Value local_50;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  if (bVar1) {
    pEVar2 = parseParenthesisedExpression(this);
    return pEVar2;
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3459);
  if (bVar1) {
    soul::Value::Value(&local_50,(int32_t)(this->super_SOULTokeniser).literalIntValue);
    pEVar2 = createLiteral(this,&local_50);
    this_00 = &local_50;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3464);
    if (bVar1) {
      soul::Value::Value(&local_90,(this->super_SOULTokeniser).literalIntValue);
      pEVar2 = createLiteral(this,&local_90);
      this_00 = &local_90;
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2a34fe);
      if (bVar1) {
        soul::Value::Value(&local_d0,(this->super_SOULTokeniser).literalDoubleValue);
        pEVar2 = createLiteral(this,&local_d0);
        this_00 = &local_d0;
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3507);
        if (bVar1) {
          soul::Value::Value(&local_110,(float)(this->super_SOULTokeniser).literalDoubleValue);
          pEVar2 = createLiteral(this,&local_110);
          this_00 = &local_110;
        }
        else {
          pcVar3 = "$imag32";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x2a34ee);
          if (bVar1) {
            soul::Value::Value(&local_150,(complex<float>)pcVar3);
            pEVar2 = createLiteral(this,&local_150);
            this_00 = &local_150;
          }
          else {
            pcVar3 = "$imag64";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)0x2a34f6);
            if (bVar1) {
              v._M_value._8_8_ = extraout_RDX;
              v._M_value._0_8_ = pcVar3;
              soul::Value::Value(&local_190,v);
              pEVar2 = createLiteral(this,&local_190);
              this_00 = &local_190;
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x2a34c2);
              if (bVar1) {
                text._M_str = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
                text._M_len = (this->super_SOULTokeniser).currentStringValue._M_string_length;
                h = StringDictionary::getHandleForString(&this->allocator->stringDictionary,text);
                soul::Value::createStringLiteral(&local_1d0,h);
                pEVar2 = createLiteral(this,&local_1d0);
                this_00 = &local_1d0;
              }
              else {
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)0x2c6d2f);
                if (bVar1) {
                  soul::Value::Value(&local_210,true);
                  pEVar2 = createLiteral(this,&local_210);
                  this_00 = &local_210;
                }
                else {
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)0x2c6d63);
                  if (!bVar1) {
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matchIf<soul::TokenType>
                                      (&this->super_SOULTokeniser,(TokenType)0x2c4fee);
                    if (!bVar1) {
                      tryParsingType((StructuralParser *)&type,(ParseTypeContext)this);
                      if (type.object == (Expression *)0x0) {
                        expression = parseQualifiedIdentifier(this);
                      }
                      else {
                        expression = (QualifiedIdentifier *)
                                     pool_ptr<soul::AST::Expression>::operator*(&type);
                      }
                      pEVar2 = parseSuffixes(this,&expression->super_Expression);
                      return pEVar2;
                    }
                    pEVar2 = &parseProcessorProperty(this)->super_Expression;
                    return pEVar2;
                  }
                  soul::Value::Value(&local_250,false);
                  pEVar2 = createLiteral(this,&local_250);
                  this_00 = &local_250;
                }
              }
            }
          }
        }
      }
    }
  }
  soul::Value::~Value(this_00);
  return pEVar2;
}

Assistant:

AST::Expression& parseFactor()
    {
        if (matchIf (Operator::openParen))     return parseParenthesisedExpression();
        if (matches (Token::literalInt32))     return createLiteral (Value::createInt32 (literalIntValue));
        if (matches (Token::literalInt64))     return createLiteral (Value::createInt64 (literalIntValue));
        if (matches (Token::literalFloat64))   return createLiteral (Value (literalDoubleValue));
        if (matches (Token::literalFloat32))   return createLiteral (Value (static_cast<float> (literalDoubleValue)));
        if (matches (Token::literalImag32))    return createLiteral (Value (std::complex (0.0f, static_cast<float> (literalDoubleValue))));
        if (matches (Token::literalImag64))    return createLiteral (Value (std::complex (0.0, static_cast<double> (literalDoubleValue))));
        if (matches (Token::literalString))    return createLiteral (Value::createStringLiteral (allocator.stringDictionary.getHandleForString (currentStringValue)));
        if (matches (Keyword::true_))          return createLiteral (Value (true));
        if (matches (Keyword::false_))         return createLiteral (Value (false));
        if (matchIf (Keyword::processor))      return parseProcessorProperty();

        if (auto type = tryParsingType (ParseTypeContext::nameOrType))
            return parseSuffixes (*type);

        return parseSuffixes (parseQualifiedIdentifier());
    }